

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

PointerType __thiscall capnp::_::PointerReader::getPointerType(PointerReader *this)

{
  WirePointer *pWVar1;
  word *pwVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *this_00;
  ulong uVar8;
  WirePointer *pWVar9;
  WirePointer *pWVar10;
  SegmentReader *newSegment;
  SegmentReader *sgmt;
  DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> _kjCondition;
  Fault f_2;
  
  this_00 = (DebugComparison<capnp::_::SegmentReader_*&,_std::nullptr_t> *)&newSegment;
  pWVar1 = this->pointer;
  if (pWVar1 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar5 = (pWVar1->offsetAndKind).value;
  if ((pWVar1->field_1).upper32Bits == 0 && uVar5 == 0) {
    return NULL_;
  }
  sgmt = this->segment;
  pWVar10 = pWVar1 + 1;
  lVar7 = (long)((int)uVar5 >> 2);
  if (sgmt == (SegmentReader *)0x0) {
    pWVar9 = pWVar10 + lVar7;
  }
  else {
    pwVar2 = (sgmt->ptr).ptr;
    pWVar9 = (WirePointer *)(pwVar2 + (sgmt->ptr).size_);
    if (((long)pwVar2 - (long)pWVar10 >> 3 <= lVar7) && (lVar7 <= (long)pWVar9 - (long)pWVar10 >> 3)
       ) {
      pWVar9 = pWVar10 + lVar7;
    }
  }
  pWVar10 = pWVar1;
  if ((sgmt == (SegmentReader *)0x0) || (((pWVar1->offsetAndKind).value & 3) != 2))
  goto LAB_0012226f;
  iVar4 = (*sgmt->arena->_vptr_Arena[2])(sgmt->arena,(ulong)(pWVar1->field_1).upper32Bits);
  sgmt = (SegmentReader *)CONCAT44(extraout_var,iVar4);
  _kjCondition.left = &sgmt;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sgmt != (SegmentReader *)0x0;
  if (sgmt == (SegmentReader *)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[49]>
              ((Fault *)&newSegment,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x244,FAILED,"segment != nullptr",
               "_kjCondition,\"Message contains far pointer to unknown segment.\"",&_kjCondition,
               (char (*) [49])"Message contains far pointer to unknown segment.");
  }
  else {
    uVar5 = (pWVar1->offsetAndKind).value;
    uVar6 = (ulong)(uVar5 >> 3);
    uVar3 = (sgmt->ptr).size_;
    if ((long)uVar3 < (long)uVar6) {
      uVar6 = uVar3;
    }
    pWVar10 = (WirePointer *)((sgmt->ptr).ptr + uVar6);
    if (sgmt == (SegmentReader *)0x0) {
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,1);
LAB_001220a3:
      if (((pWVar1->offsetAndKind).value & 4) == 0) {
        pWVar1 = pWVar10 + 1;
        lVar7 = (long)((int)(pWVar10->offsetAndKind).value >> 2);
        if (sgmt == (SegmentReader *)0x0) {
          pWVar9 = pWVar1 + lVar7;
        }
        else {
          pwVar2 = (sgmt->ptr).ptr;
          pWVar9 = (WirePointer *)(pwVar2 + (sgmt->ptr).size_);
          if (((long)pwVar2 - (long)pWVar1 >> 3 <= lVar7) &&
             (lVar7 <= (long)pWVar9 - (long)pWVar1 >> 3)) {
            pWVar9 = pWVar1 + lVar7;
          }
        }
        goto LAB_0012226f;
      }
      iVar4 = (*sgmt->arena->_vptr_Arena[2])(sgmt->arena,(ulong)(pWVar10->field_1).upper32Bits);
      newSegment = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
      _kjCondition.right = (void *)0x0;
      _kjCondition.op.content.ptr = " != ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = newSegment != (SegmentReader *)0x0;
      if (newSegment == (SegmentReader *)0x0) {
        _kjCondition.left = &newSegment;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::SegmentReader*&,decltype(nullptr)>&,char_const(&)[56]>
                  (&f_2,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x25f,FAILED,"newSegment != nullptr",
                   "_kjCondition,\"Message contains double-far pointer to unknown segment.\"",
                   &_kjCondition,
                   (char (*) [56])"Message contains double-far pointer to unknown segment.");
LAB_0012225c:
        pWVar9 = (WirePointer *)0x0;
        kj::_::Debug::Fault::~Fault(&f_2);
      }
      else {
        uVar5 = (pWVar10->offsetAndKind).value & 3;
        _kjCondition.left = (SegmentReader **)CONCAT44(2,uVar5);
        _kjCondition.right = anon_var_dwarf_1d86e;
        _kjCondition.op.content.ptr = (char *)0x5;
        _kjCondition.op.content.size_ = (size_t)(uVar5 == 2);
        if (uVar5 != 2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[51]>
                    (&f_2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                     ,0x263,FAILED,"pad->kind() == WirePointer::FAR",
                     "_kjCondition,\"Second word of double-far pad must be far pointer.\"",
                     (DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> *)
                     &_kjCondition,
                     (char (*) [51])"Second word of double-far pad must be far pointer.");
          goto LAB_0012225c;
        }
        uVar6 = (ulong)((pWVar10->offsetAndKind).value >> 3);
        uVar3 = (newSegment->ptr).size_;
        if ((long)uVar3 < (long)uVar6) {
          uVar6 = uVar3;
        }
        pWVar9 = (WirePointer *)((newSegment->ptr).ptr + uVar6);
        sgmt = newSegment;
      }
      pWVar10 = pWVar10 + 1;
      goto LAB_0012226f;
    }
    uVar8 = 2 - (ulong)((uVar5 & 4) == 0);
    if (uVar3 < uVar6 + uVar8) {
      newSegment = (SegmentReader *)((ulong)newSegment._1_7_ << 8);
    }
    else {
      uVar3 = sgmt->readLimiter->limit;
      if (uVar3 < uVar8) {
        (*sgmt->arena->_vptr_Arena[3])();
      }
      else {
        sgmt->readLimiter->limit = uVar3 - uVar8;
      }
      newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar8 <= uVar3);
      if (uVar8 <= uVar3) goto LAB_001220a3;
    }
    this_00 = &_kjCondition;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[318]>
              ((Fault *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x24d,FAILED,"boundsCheck(segment, ptr, padWords)",
               "_kjCondition,\"Message contains out-of-bounds far pointer. \" OUT_OF_BOUNDS_ERROR_DETAIL"
               ,(DebugExpression<bool> *)&newSegment,
               (char (*) [318])
               "Message contains out-of-bounds far pointer. This usually indicates that the input data was corrupted, used a different encoding than specified (e.g. packed vs. non-packed), or was not a Cap\'n Proto message to begin with. Note that this error is NOT due to a schema mismatch; the input is invalid regardless of schema."
              );
  }
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  pWVar9 = (WirePointer *)0x0;
  pWVar10 = pWVar1;
LAB_0012226f:
  if (pWVar9 == (WirePointer *)0x0) {
    return NULL_;
  }
  uVar5 = (pWVar10->offsetAndKind).value;
  switch(uVar5 & 3) {
  case 0:
    return STRUCT;
  case 1:
    return LIST;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xad5,FAILED,(char *)0x0,"\"far pointer not followed?\"",
               (char (*) [26])"far pointer not followed?");
    break;
  case 3:
    newSegment = (SegmentReader *)CONCAT71(newSegment._1_7_,uVar5 == 3);
    if (uVar5 == 3) {
      return CAPABILITY;
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xadb,FAILED,"ptr->isCapability()","_kjCondition,\"unknown pointer type\"",
               (DebugExpression<bool> *)&newSegment,(char (*) [21])"unknown pointer type");
  }
  kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition);
  return NULL_;
}

Assistant:

PointerType PointerReader::getPointerType() const {
  if(pointer == nullptr || pointer->isNull()) {
    return PointerType::NULL_;
  } else {
    const WirePointer* ptr = pointer;
    const word* refTarget = ptr->target(segment);
    SegmentReader* sgmt = segment;
    if (WireHelpers::followFars(ptr, refTarget, sgmt) == kj::none) return PointerType::NULL_;
    switch(ptr->kind()) {
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("far pointer not followed?") { return PointerType::NULL_; }
      case WirePointer::STRUCT:
        return PointerType::STRUCT;
      case WirePointer::LIST:
        return PointerType::LIST;
      case WirePointer::OTHER:
        KJ_REQUIRE(ptr->isCapability(), "unknown pointer type") { return PointerType::NULL_; }
        return PointerType::CAPABILITY;
    }
    KJ_UNREACHABLE;
  }
}